

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lrit.cc
# Opt level: O2

HeaderStructureRecordHeader * __thiscall
lrit::getHeader<lrit::HeaderStructureRecordHeader>
          (HeaderStructureRecordHeader *__return_storage_ptr__,lrit *this,Buffer *b,int pos)

{
  undefined4 in_register_0000000c;
  HeaderReader<lrit::HeaderStructureRecordHeader> r;
  undefined1 local_50 [24];
  _Alloc_hider local_38;
  size_type local_30;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_28;
  
  local_50._8_4_ = SUB84(b,0);
  local_38._M_p = (pointer)&local_28;
  local_30 = 0;
  local_28._M_local_buf[0] = '\0';
  local_50._0_8_ = this;
  HeaderReader<lrit::HeaderStructureRecordHeader>::getHeader
            (__return_storage_ptr__,(HeaderReader<lrit::HeaderStructureRecordHeader> *)local_50);
  HeaderReader<lrit::HeaderStructureRecordHeader>::read
            ((HeaderReader<lrit::HeaderStructureRecordHeader> *)local_50,
             (int)__return_storage_ptr__ + 8,
             (void *)((ulong)__return_storage_ptr__->headerLength - 3),
             CONCAT44(in_register_0000000c,pos));
  std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

HeaderStructureRecordHeader getHeader(const Buffer& b, int pos) {
  auto r = HeaderReader<HeaderStructureRecordHeader>(b, pos);
  auto h = r.getHeader();
  r.read(h.headerStructure, h.headerLength - 3);
  return h;
}